

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::AddConstraintAndTryNoteResultVariable<mp::LinearFunctionalConstraint>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,LinearFunctionalConstraint *con)

{
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
  *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  Error *this_01;
  uint uVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::reference_wrapper<const_mp::LinearFunctionalConstraint>,_int>,_false,_true>,_bool>
  pVar5;
  NodeRange NVar6;
  ConInfo ci;
  ConInfo local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = (con->super_FunctionalConstraint).result_var_;
  this_00 = &this->ck__LinearFunctionalConstraint_;
  iVar3 = ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
          ::AddConstraint<mp::LinearFunctionalConstraint>(this_00,this->constr_depth_,con);
  local_50.pck_ = &this_00->super_BasicConstraintKeeper;
  local_50.index_ = iVar3;
  if (-1 < iVar1) {
    AddInitExpression(this,iVar1,&local_50);
  }
  local_40._M_dataplus._M_p =
       (pointer)ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
                ::GetConstraint(this_00,iVar3);
  local_40._M_string_length._0_4_ = iVar3;
  pVar5 = std::
          _Hashtable<std::reference_wrapper<mp::LinearFunctionalConstraint_const>,std::pair<std::reference_wrapper<mp::LinearFunctionalConstraint_const>const,int>,std::allocator<std::pair<std::reference_wrapper<mp::LinearFunctionalConstraint_const>const,int>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<mp::LinearFunctionalConstraint_const>>,std::hash<std::reference_wrapper<mp::LinearFunctionalConstraint_const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::reference_wrapper<mp::LinearFunctionalConstraint_const>const,int>>
                    ((_Hashtable<std::reference_wrapper<mp::LinearFunctionalConstraint_const>,std::pair<std::reference_wrapper<mp::LinearFunctionalConstraint_const>const,int>,std::allocator<std::pair<std::reference_wrapper<mp::LinearFunctionalConstraint_const>const,int>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<mp::LinearFunctionalConstraint_const>>,std::hash<std::reference_wrapper<mp::LinearFunctionalConstraint_const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->map__LinearFunctionalConstraint_);
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    uVar2 = (uint)(this->ck__LinearFunctionalConstraint_).super_BasicConstraintKeeper.value_node_.
                  sz_;
    uVar4 = iVar3 >> 0x1f & uVar2;
    iVar1 = uVar4 + iVar3;
    iVar3 = uVar4 + iVar3 + 1;
    if ((int)uVar2 <= iVar1) {
      (this->ck__LinearFunctionalConstraint_).super_BasicConstraintKeeper.value_node_.sz_ =
           (long)iVar3;
    }
    NVar6.ir_.end_ = iVar3;
    NVar6.ir_.beg_ = iVar1;
    NVar6.pvn_ = &(this->ck__LinearFunctionalConstraint_).super_BasicConstraintKeeper.value_node_;
    return NVar6;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x18);
  std::operator+(&local_40,"Trying to MapInsert() duplicated constraint: ",
                 &(this->ck__LinearFunctionalConstraint_).desc_);
  Error::Error(this_01,(CStringRef)local_40._M_dataplus._M_p,-1);
  __cxa_throw(this_01,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }